

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

void mdl_free(mdl_t *mdl)

{
  free(mdl->kind);
  free(mdl->uoff);
  free(mdl->boff);
  if (mdl->theta != (double *)0x0) {
    xvm_free(mdl->theta);
  }
  if (mdl->train != (dat_t *)0x0) {
    rdr_freedat(mdl->train);
  }
  if (mdl->devel != (dat_t *)0x0) {
    rdr_freedat(mdl->devel);
  }
  if (mdl->reader != (rdr_t *)0x0) {
    rdr_free(mdl->reader);
  }
  if (mdl->werr != (double *)0x0) {
    free(mdl->werr);
  }
  free(mdl);
  return;
}

Assistant:

void mdl_free(mdl_t *mdl) {
	free(mdl->kind);
	free(mdl->uoff);
	free(mdl->boff);
	if (mdl->theta != NULL)
		xvm_free(mdl->theta);
	if (mdl->train != NULL)
		rdr_freedat(mdl->train);
	if (mdl->devel != NULL)
		rdr_freedat(mdl->devel);
	if (mdl->reader != NULL)
		rdr_free(mdl->reader);
	if (mdl->werr != NULL)
		free(mdl->werr);
	free(mdl);
}